

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O3

bool __thiscall QMakeSourceFileInfo::findMocs(QMakeSourceFileInfo *this,SourceFile *file)

{
  char *__s;
  char cVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int start;
  QString *pQVar6;
  char *buffer;
  size_t sVar7;
  long lVar8;
  size_t __n;
  int buffer_len;
  char16_t *pcVar9;
  long lVar10;
  char (*__s_00) [19];
  long lVar11;
  undefined4 *puVar12;
  long in_FS_OFFSET;
  int extralines_1;
  int extralines;
  int line_count;
  bool ignore [5];
  int morelines;
  char local_b4;
  int local_8c;
  int local_88;
  uint local_84;
  QMakeLocalFileName local_80;
  undefined4 local_50;
  undefined1 local_4c;
  undefined1 *local_48;
  undefined4 uStack_40;
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b4 = '\x01';
  if ((file->field_0x3c & 8) == 0) {
    this->files_changed = true;
    file->field_0x3c = file->field_0x3c | 8;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_40 = 0xaaaaaaaa;
    uStack_3c = 0xaaaaaaaa;
    (**this->_vptr_QMakeSourceFileInfo)(&local_80,this,file);
    pQVar6 = QMakeLocalFileName::local(&local_80);
    QFile::QFile((QFile *)&local_48,(QString *)pQVar6);
    if (&(local_80.local_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_80.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_80.local_name.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_80.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_80.real_name.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_b4 = QFile::open(&local_48,1);
    if (local_b4 == '\0') {
      QFile::~QFile((QFile *)&local_48);
      local_b4 = '\0';
    }
    else {
      iVar4 = QFile::size();
      buffer = this->spare_buffer;
      if ((buffer == (char *)0x0) || (this->spare_buffer_size < iVar4)) {
        this->spare_buffer_size = iVar4;
        buffer = (char *)realloc(buffer,(long)iVar4);
        this->spare_buffer = buffer;
      }
      iVar4 = 0;
      do {
        buffer_len = iVar4;
        iVar5 = QIODevice::read((char *)&local_48,(longlong)(buffer + buffer_len));
        iVar4 = iVar5 + buffer_len;
      } while (iVar5 != 0);
      QFile::~QFile((QFile *)&local_48);
      if (Option::debug_level != 0) {
        QMakeLocalFileName::local(&file->file);
        QString::toLatin1_helper((QString *)&local_80);
        pcVar9 = local_80.real_name.d.ptr;
        if (local_80.real_name.d.ptr == (char16_t *)0x0) {
          pcVar9 = (char16_t *)&QByteArray::_empty;
        }
        debug_msg_internal(2,"findMocs: %s",pcVar9);
        if (&(local_80.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_80.real_name.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      local_84 = 1;
      local_4c = 0;
      local_50 = 0;
      if (0 < buffer_len) {
        iVar4 = 0;
        do {
          iVar4 = skipEscapedLineEnds(buffer,buffer_len,iVar4,(int *)&local_84);
          cVar1 = buffer[iVar4];
          if ((cVar1 == '\"') || (cVar1 == '\'')) {
            iVar4 = scanPastString(buffer,buffer_len,iVar4,(int *)&local_84);
          }
          else if (cVar1 == '/') {
            local_88 = 0;
            iVar5 = skipEscapedLineEnds(buffer,buffer_len,iVar4 + 1,&local_88);
            if (iVar5 < buffer_len) {
              if (buffer[iVar5] == '*') {
                local_84 = local_84 + local_88;
                for (iVar5 = skipEscapedLineEnds(buffer,buffer_len,iVar5 + 1,(int *)&local_84);
                    iVar4 = iVar5, iVar5 < buffer_len;
                    iVar5 = skipEscapedLineEnds(buffer,buffer_len,iVar5 + 1,(int *)&local_84)) {
                  cVar1 = buffer[iVar5];
                  if (cVar1 == '*') {
                    local_88 = 0;
                    iVar4 = skipEscapedLineEnds(buffer,buffer_len,iVar5 + 1,&local_88);
                    if ((iVar4 < buffer_len) && (buffer[iVar4] == '/')) {
                      local_84 = local_84 + local_88;
                      break;
                    }
                  }
                  else if ((cVar1 == 't') || (cVar1 == 'q')) {
                    local_48 = (undefined1 *)0x6e676920656b616d;
                    uStack_40 = 0x2065726f;
                    uStack_3c = uStack_3c & 0xffffff00;
                    puVar12 = &local_50;
                    lVar10 = 0;
                    do {
                      __s = findMocs::keywords[0] + lVar10;
                      sVar7 = strlen(__s);
                      if ((int)sVar7 + iVar5 + 0xc <= buffer_len) {
                        __n = strlen((char *)&local_48);
                        iVar4 = strncmp(buffer + (long)iVar5 + 1,(char *)&local_48,__n);
                        if ((iVar4 == 0) &&
                           (iVar4 = strncmp(buffer + (long)iVar5 + 0xd,__s,sVar7), iVar4 == 0)) {
                          if (Option::debug_level != 0) {
                            QString::toLatin1_helper((QString *)&local_80);
                            pcVar9 = local_80.real_name.d.ptr;
                            if (local_80.real_name.d.ptr == (char16_t *)0x0) {
                              pcVar9 = (char16_t *)&QByteArray::_empty;
                            }
                            debug_msg_internal(2,"Mocgen: %s:%d Found \"q%s%s\"",pcVar9,
                                               (ulong)local_84,&local_48,__s);
                            if (&(local_80.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                              LOCK();
                              ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i =
                                   ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.
                                   super___atomic_base<int>._M_i + -1;
                              UNLOCK();
                              if (((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i == 0) {
                                QArrayData::deallocate
                                          (&(local_80.real_name.d.d)->super_QArrayData,1,0x10);
                              }
                            }
                          }
                          sVar7 = strlen(__s);
                          iVar5 = iVar5 + (int)sVar7 + 0xc;
                          *(undefined1 *)puVar12 = 1;
                        }
                      }
                      lVar10 = lVar10 + 0x13;
                      puVar12 = (undefined4 *)((long)puVar12 + 1);
                    } while (lVar10 != 0x5f);
                  }
                  else if ((Option::debug_level != 0) && ((cVar1 == '\r' || (cVar1 == '\n')))) {
                    local_84 = local_84 + 1;
                  }
                }
              }
              else if (buffer[iVar5] == '/') {
                local_84 = local_84 + local_88;
                iVar4 = iVar5;
                do {
                  iVar4 = skipEscapedLineEnds(buffer,buffer_len,iVar4 + 1,(int *)&local_84);
                  if ((buffer_len <= iVar4) || (buffer[iVar4] == '\n')) break;
                } while (buffer[iVar4] != '\r');
              }
            }
          }
          iVar5 = Option::debug_level;
          if ((Option::debug_level != 0 && iVar4 < buffer_len) &&
             ((buffer[iVar4] == '\r' || (buffer[iVar4] == '\n')))) {
            local_84 = local_84 + 1;
          }
          if ((((iVar4 + 8 < buffer_len) && (bVar2 = buffer[iVar4], 9 < (byte)(bVar2 - 0x30))) &&
              (bVar2 != 0x5f)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
            local_48 = (undefined1 *)((ulong)local_48 & 0xffffffff00000000);
            start = skipEscapedLineEnds(buffer,buffer_len,iVar4 + 1,(int *)&local_48);
            lVar10 = (long)start;
            if (buffer[lVar10] == 'Q') {
              __s_00 = findMocs::keywords;
              lVar11 = 0;
              do {
                if (*(char *)((long)&local_50 + lVar11) == '\0') {
                  local_88 = 0;
                  local_8c = 0;
                  sVar7 = strlen(*__s_00);
                  bVar3 = matchWhileUnsplitting
                                    (buffer,buffer_len,start,*__s_00,(int)sVar7,&local_88,&local_8c)
                  ;
                  if (((bVar3) && (lVar8 = local_88 + lVar10, (int)lVar8 < buffer_len)) &&
                     ((bVar2 = buffer[lVar8], 9 < (byte)(bVar2 - 0x30) &&
                      ((bVar2 != 0x5f && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))))))) {
                    if ((iVar5 != 0) && (buffer[lVar8] = '\0', Option::debug_level != 0)) {
                      QString::toLatin1_helper((QString *)&local_80);
                      if (local_80.real_name.d.ptr == (char16_t *)0x0) {
                        local_80.real_name.d.ptr = (char16_t *)&QByteArray::_empty;
                      }
                      debug_msg_internal(2,"Mocgen: %s:%d Found MOC symbol %s",
                                         local_80.real_name.d.ptr,(ulong)((int)local_48 + local_84),
                                         buffer + lVar10);
                      if (&(local_80.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i =
                             ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_80.real_name.d.d)->super_QArrayData,1,0x10)
                          ;
                        }
                      }
                    }
                    file->field_0x3c = file->field_0x3c | 1;
                    goto LAB_00194d5d;
                  }
                }
                lVar11 = lVar11 + 1;
                __s_00 = __s_00 + 1;
              } while (lVar11 != 5);
            }
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < buffer_len);
      }
    }
  }
LAB_00194d5d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)local_b4;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeSourceFileInfo::findMocs(SourceFile *file)
{
    if(file->moc_checked)
        return true;
    files_changed = true;
    file->moc_checked = true;

    int buffer_len = 0;
    char *buffer = nullptr;
    {
        QFile f(fixPathForFile(file->file, true).local());
        if (!f.open(QIODevice::ReadOnly))
            return false; //shouldn't happen
        const qint64 fs = f.size();
        buffer = getBuffer(fs);
        while (int have_read = f.read(buffer + buffer_len, fs - buffer_len))
            buffer_len += have_read;
    }

    debug_msg(2, "findMocs: %s", file->file.local().toLatin1().constData());
    int line_count = 1;
    enum Keywords {
        Q_OBJECT_Keyword,
        Q_GADGET_Keyword,
        Q_GADGET_EXPORT_Keyword,
        Q_NAMESPACE_Keyword,
        Q_NAMESPACE_EXPORT_Keyword,

        NumKeywords
    };
    static const char keywords[][19] = {
        "Q_OBJECT",
        "Q_GADGET",
        "Q_GADGET_EXPORT",
        "Q_NAMESPACE",
        "Q_NAMESPACE_EXPORT",
    };
    static_assert(std::size(keywords) == NumKeywords);
    bool ignore[NumKeywords] = {};
 /* qmake ignore Q_GADGET */
 /* qmake ignore Q_GADGET_EXPORT */
 /* qmake ignore Q_OBJECT */
 /* qmake ignore Q_NAMESPACE */
 /* qmake ignore Q_NAMESPACE_EXPORT */
    for(int x = 0; x < buffer_len; x++) {
#define SKIP_BSNL(pos) skipEscapedLineEnds(buffer, buffer_len, (pos), &line_count)
        x = SKIP_BSNL(x);
        if (buffer[x] == '/') {
            int extralines = 0;
            int y = skipEscapedLineEnds(buffer, buffer_len, x + 1, &extralines);
            if (buffer_len > y) {
                // If comment, advance to the character that ends it:
                if (buffer[y] == '/') { // C++-style comment
                    line_count += extralines;
                    x = y;
                    do {
                        x = SKIP_BSNL(x + 1);
                    } while (x < buffer_len && !qmake_endOfLine(buffer[x]));

                } else if (buffer[y] == '*') { // C-style comment
                    line_count += extralines;
                    x = SKIP_BSNL(y + 1);
                    for (; x < buffer_len; x = SKIP_BSNL(x + 1)) {
                        if (buffer[x] == 't' || buffer[x] == 'q') { // ignore
                            const char tag[] = "make ignore ";
                            const auto starts_with = [](const char *haystack, const char *needle) {
                                return strncmp(haystack, needle, strlen(needle)) == 0;
                            };
                            const auto is_ignore = [&](const char *keyword) {
                                return buffer_len >= int(x + strlen(tag) + strlen(keyword)) &&
                                        starts_with(buffer + x + 1, tag) &&
                                        starts_with(buffer + x + 1 + strlen(tag), keyword);
                            };
                            int interest = 0;
                            for (const char *keyword : keywords) {
                                if (is_ignore(keyword)){
                                    debug_msg(2, "Mocgen: %s:%d Found \"q%s%s\"",
                                              file->file.real().toLatin1().constData(), line_count,
                                              tag, keyword);
                                    x += static_cast<int>(strlen(tag));
                                    x += static_cast<int>(strlen(keyword));
                                    ignore[interest] = true;
                                }
                                ++interest;
                            }
                        } else if (buffer[x] == '*') {
                            extralines = 0;
                            y = skipEscapedLineEnds(buffer, buffer_len, x + 1, &extralines);
                            if (buffer_len > y && buffer[y] == '/') {
                                line_count += extralines;
                                x = y;
                                break;
                            }
                        } else if (Option::debug_level && qmake_endOfLine(buffer[x])) {
                            ++line_count;
                        }
                    }
                }
                // else: don't update x, buffer[x] is just the division operator.
            }
        } else if (buffer[x] == '\'' || buffer[x] == '"') {
            x = scanPastString(buffer, buffer_len, x, &line_count);
            // Leaves us on closing quote; for loop's x++ steps us past it.
        }

        if (x < buffer_len && Option::debug_level && qmake_endOfLine(buffer[x]))
            ++line_count;
        if (buffer_len > x + 8 && !isCWordChar(buffer[x])) {
            int morelines = 0;
            int y = skipEscapedLineEnds(buffer, buffer_len, x + 1, &morelines);
            if (buffer[y] == 'Q') {
                for (int interest = 0; interest < NumKeywords; ++interest) {
                    if (ignore[interest])
                        continue;

                    int matchlen = 0, extralines = 0;
                    size_t needle_len = strlen(keywords[interest]);
                    Q_ASSERT(needle_len <= INT_MAX);
                    if (matchWhileUnsplitting(buffer, buffer_len, y,
                                              keywords[interest],
                                              static_cast<int>(needle_len),
                                              &matchlen, &extralines)
                        && y + matchlen < buffer_len
                        && !isCWordChar(buffer[y + matchlen])) {
                        if (Option::debug_level) {
                            buffer[y + matchlen] = '\0';
                            debug_msg(2, "Mocgen: %s:%d Found MOC symbol %s",
                                      file->file.real().toLatin1().constData(),
                                      line_count + morelines, buffer + y);
                        }
                        file->mocable = true;
                        return true;
                    }
                }
            }
        }
#undef SKIP_BSNL
    }
    return true;
}